

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

void test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
               (unsigned_long_long num1,_func_int_char_ptr_ptr_double_ptr *read_f,bool is_ok)

{
  byte bVar1;
  mp_type mVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  ulong uVar8;
  char (*pacVar9) [16];
  double dVar10;
  undefined4 extraout_EDX;
  undefined7 in_register_00000011;
  uint uVar11;
  long lVar12;
  undefined8 *puVar13;
  char *unaff_RBP;
  char (*mp_nums_00) [16];
  code *pcVar14;
  char *pcVar15;
  char *fmt;
  ulong uVar16;
  undefined8 *puVar17;
  char *pcVar18;
  byte *__maxlen;
  char *pcVar19;
  bool bVar20;
  char *mp_num_pos2;
  double num2;
  char mp_nums [16] [16];
  char str [256];
  double dStack_950;
  undefined1 *puStack_948;
  char acStack_940 [256];
  undefined1 uStack_840;
  undefined8 uStack_83f;
  undefined1 auStack_837 [247];
  undefined8 *puStack_740;
  byte *pbStack_738;
  code *pcStack_730;
  double dStack_720;
  undefined8 *puStack_718;
  char (*pacStack_710) [16];
  char acStack_708 [256];
  byte bStack_608;
  undefined1 auStack_607 [2];
  undefined1 auStack_605 [6];
  undefined8 uStack_5ff;
  undefined8 uStack_5f7;
  long lStack_500;
  ulong uStack_4f8;
  char *pcStack_4f0;
  char *pcStack_4e8;
  char *pcStack_4e0;
  code *pcStack_4d8;
  char (*pacStack_4d0) [16];
  char *pcStack_4c8;
  float fStack_4c0;
  undefined4 uStack_4bc;
  double dStack_4b8;
  double dStack_4b0;
  code *pcStack_4a8;
  char acStack_4a0 [256];
  byte bStack_3a0;
  undefined8 uStack_39f;
  char acStack_397 [255];
  long lStack_298;
  ulong uStack_290;
  char *pcStack_288;
  char *pcStack_280;
  char *pcStack_278;
  code *pcStack_270;
  ulong local_268;
  char *local_260;
  float local_258;
  undefined4 local_254;
  double local_250;
  double local_248;
  _func_int_char_ptr_ptr_double_ptr *local_240;
  byte local_238;
  undefined8 local_237;
  char acStack_22f [247];
  char local_138 [256];
  undefined1 local_38 [8];
  
  local_254 = (undefined4)CONCAT71(in_register_00000011,is_ok);
  builtin_strncpy(local_138,"typed read of ",0xf);
  pcStack_270 = (code *)0x13128b;
  local_240 = read_f;
  iVar3 = snprintf(local_138 + 0xe,0xf2,"%llu",num1);
  pcVar18 = local_138 + (long)iVar3 + 0xe;
  pcStack_270 = (code *)0x1312af;
  iVar3 = snprintf(pcVar18,(size_t)(local_38 + -(long)pcVar18)," into ");
  pcStack_270 = (code *)0x1312c9;
  snprintf(pcVar18 + iVar3,(size_t)(local_38 + -(long)(pcVar18 + iVar3)),"double");
  pcStack_270 = (code *)0x1312d8;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x1312f1;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x131301;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x13130e;
  fputc(10,_stdout);
  pcStack_270 = (code *)0x13131b;
  iVar3 = test_encode_uint_all_sizes((char (*) [16])&local_238,num1);
  pacVar9 = (char (*) [16])(&local_238 + (long)iVar3 * 0x10);
  pcStack_270 = (code *)0x131339;
  local_268 = num1;
  iVar4 = test_encode_int_all_sizes(pacVar9,num1);
  uVar11 = iVar3 + iVar4;
  if (uVar11 != 0 && SCARRY4(iVar3,iVar4) == (int)uVar11 < 0) {
    local_258 = (float)(long)local_268;
    local_250 = (double)(long)local_268;
    uVar16 = (ulong)uVar11;
    pcVar19 = (char *)((long)&local_237 + 1);
    lVar12 = 0;
    do {
      lVar5 = lVar12 * 0x10;
      bVar1 = pcVar19[-2];
      uVar8 = (ulong)bVar1;
      mVar2 = mp_type_hint[uVar8];
      pcVar15 = pcVar19;
      if (mVar2 == MP_UINT) {
        switch(bVar1) {
        case 0xcc:
          uVar8 = (ulong)(byte)pcVar19[-1];
          break;
        case 0xcd:
          uVar8 = (ulong)(ushort)(*(ushort *)(pcVar19 + -1) << 8 | *(ushort *)(pcVar19 + -1) >> 8);
          pcVar15 = acStack_22f + lVar5 + -6;
          break;
        case 0xce:
          uVar11 = *(uint *)(pcVar19 + -1);
          uVar8 = (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                         uVar11 << 0x18);
          pcVar15 = acStack_22f + lVar5 + -4;
          break;
        case 0xcf:
          uVar8 = *(ulong *)(pcVar19 + -1);
          uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                  (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                  (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                  | uVar8 << 0x38;
          pcVar15 = acStack_22f + lVar12 * 0x10;
          break;
        default:
          if ((char)bVar1 < '\0') {
LAB_00131627:
            pcStack_270 = (code *)0x13162c;
            test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_0013162c:
            pcStack_270 = (code *)0x131631;
            test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131631:
            pcStack_270 = (code *)0x131650;
            __assert_fail("c == 0xcb",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x987,"double mp_decode_double(const char **)");
          }
          pcVar15 = acStack_22f + (lVar12 * 2 + -1) * 8;
        }
        if (uVar8 != local_268) {
          pcStack_270 = (code *)0x131679;
          test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131679:
          pcStack_270 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
          test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
          builtin_strncpy(acStack_4a0,"typed read of ",0xf);
          pcStack_4d8 = (code *)0x1316e2;
          uStack_4bc = extraout_EDX;
          pcStack_4a8 = (code *)num1;
          lStack_298 = lVar12;
          uStack_290 = uVar16;
          pcStack_288 = pcVar18;
          pcStack_280 = pcVar15;
          pcStack_278 = pcVar19;
          pcStack_270 = (code *)unaff_RBP;
          iVar3 = snprintf(acStack_4a0 + 0xe,0xf2,"%lld",pacVar9);
          pcVar18 = acStack_4a0 + (long)iVar3 + 0xe;
          pcStack_4d8 = (code *)0x131703;
          iVar3 = snprintf(pcVar18,(size_t)(&bStack_3a0 + -(long)pcVar18)," into ");
          pcStack_4d8 = (code *)0x13171d;
          snprintf(pcVar18 + iVar3,(size_t)(&bStack_3a0 + -(long)(pcVar18 + iVar3)),"double");
          pcStack_4d8 = (code *)0x13172c;
          _space((FILE *)_stdout);
          pcStack_4d8 = (code *)0x131745;
          fwrite("# ",2,1,_stdout);
          pcStack_4d8 = (code *)0x131752;
          fputs(acStack_4a0,_stdout);
          pcStack_4d8 = (code *)0x13175f;
          fputc(10,_stdout);
          mp_nums_00 = (char (*) [16])&bStack_3a0;
          pcStack_4d8 = (code *)0x131773;
          pacStack_4d0 = pacVar9;
          uVar11 = test_encode_int_all_sizes(mp_nums_00,(int64_t)pacVar9);
          if ((int)uVar11 < 1) {
            return;
          }
          fStack_4c0 = (float)(long)pacStack_4d0;
          dStack_4b8 = (double)(long)pacStack_4d0;
          uVar16 = (ulong)uVar11;
          pcVar19 = (char *)((long)&uStack_39f + 1);
          lVar12 = 0;
          goto LAB_001317a5;
        }
      }
      else if (mVar2 == MP_FLOAT) {
        if (bVar1 != 0xca) {
LAB_00131655:
          pcStack_270 = (code *)0x131674;
          __assert_fail("c == 0xca",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x97e,"float mp_decode_float(const char **)");
        }
        uVar11 = *(uint *)(pcVar19 + -1);
        fVar7 = (float)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                       uVar11 << 0x18);
        if ((fVar7 != local_258) || (NAN(fVar7) || NAN(local_258))) goto LAB_0013162c;
        pcVar15 = pcVar19 + 3;
      }
      else if (mVar2 == MP_INT) {
        uVar8 = (ulong)(char)bVar1;
        switch(bVar1) {
        case 0xd0:
          uVar8 = (ulong)pcVar19[-1];
          num1 = (unsigned_long_long)&switchD_001313bd::switchdataD_00139bac;
          break;
        case 0xd1:
          uVar8 = (ulong)(short)(*(ushort *)(pcVar19 + -1) << 8 | *(ushort *)(pcVar19 + -1) >> 8);
          num1 = (unsigned_long_long)&switchD_001313bd::switchdataD_00139bac;
          pcVar15 = acStack_22f + lVar5 + -6;
          break;
        case 0xd2:
          uVar11 = *(uint *)(pcVar19 + -1);
          uVar8 = (ulong)(int)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                              uVar11 << 0x18);
          num1 = (unsigned_long_long)&switchD_001313bd::switchdataD_00139bac;
          pcVar15 = acStack_22f + lVar5 + -4;
          break;
        case 0xd3:
          uVar8 = *(ulong *)(pcVar19 + -1);
          uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                  (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                  (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                  | uVar8 << 0x38;
          num1 = (unsigned_long_long)&switchD_001313bd::switchdataD_00139bac;
          pcVar15 = acStack_22f + lVar12 * 0x10;
          break;
        default:
          if (bVar1 < 0xe0) {
            pcStack_270 = (code *)0x131627;
            test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
            goto LAB_00131627;
          }
          pcVar15 = acStack_22f + (lVar12 * 2 + -1) * 8;
        }
        if (uVar8 != local_268) goto LAB_00131679;
      }
      else {
        if (bVar1 != 0xcb) goto LAB_00131631;
        uVar8 = *(ulong *)(pcVar19 + -1);
        dVar10 = (double)(uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                          (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                          (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                          (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
        if ((dVar10 != local_250) || (NAN(dVar10) || NAN(local_250))) {
          pcStack_270 = (code *)0x131655;
          test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
          goto LAB_00131655;
        }
        pcVar15 = acStack_22f + lVar12 * 0x10;
      }
      unaff_RBP = pcVar19 + -2;
      pcVar18 = (char *)(ulong)(uint)(int)(char)bVar1;
      local_248 = 0.0;
      pcStack_270 = (code *)0x131508;
      local_260 = unaff_RBP;
      iVar3 = (*local_240)(&local_260,&local_248);
      if ((char)local_254 == '\0') {
        pcStack_270 = (code *)0x1315d8;
        _ok((uint)(iVar3 == -1),"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",pcVar18);
        bVar20 = unaff_RBP == local_260;
        iVar3 = 0x738;
        pcVar15 = "check position";
        num1 = (unsigned_long_long)"mp_num_pos2 == mp_nums[i]";
      }
      else {
        unaff_RBP = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_270 = (code *)0x131542;
        _ok((uint)(iVar3 == 0),"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X",pcVar18);
        pcStack_270 = (code *)0x13156a;
        _ok((uint)(pcVar15 == local_260),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        bVar20 = ABS(local_250 - local_248) < 1e-15;
        iVar3 = 0x73e;
        pcVar15 = "check float number";
        num1 = (unsigned_long_long)"double_eq(num1, num2)";
      }
      pacVar9 = (char (*) [16])(ulong)bVar20;
      pcStack_270 = (code *)0x131600;
      _ok((uint)bVar20,(char *)num1,
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          iVar3,pcVar15);
      lVar12 = lVar12 + 1;
      pcVar19 = pcVar19 + 0x10;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  return;
LAB_001317a5:
  lVar5 = lVar12 * 0x10;
  bVar1 = pcVar19[-2];
  pacVar9 = (char (*) [16])(ulong)bVar1;
  mVar2 = mp_type_hint[(long)pacVar9];
  pcVar15 = pcVar19;
  if (mVar2 == MP_UINT) {
    switch(bVar1) {
    case 0xcc:
      pacVar9 = (char (*) [16])(ulong)(byte)pcVar19[-1];
      break;
    case 0xcd:
      pacVar9 = (char (*) [16])
                (ulong)(ushort)(*(ushort *)(pcVar19 + -1) << 8 | *(ushort *)(pcVar19 + -1) >> 8);
      pcVar15 = acStack_397 + lVar5 + -6;
      break;
    case 0xce:
      uVar11 = *(uint *)(pcVar19 + -1);
      pacVar9 = (char (*) [16])
                (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                       uVar11 << 0x18);
      pcVar15 = acStack_397 + lVar5 + -4;
      break;
    case 0xcf:
      uVar8 = *(ulong *)(pcVar19 + -1);
      pacVar9 = (char (*) [16])
                (uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                 (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                 (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38);
      pcVar15 = acStack_397 + lVar12 * 0x10;
      break;
    default:
      if ((char)bVar1 < '\0') {
LAB_00131a67:
        pcStack_4d8 = (code *)0x131a6c;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a6c:
        pcStack_4d8 = (code *)0x131a71;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a71:
        pcStack_4d8 = (code *)0x131a90;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar15 = acStack_397 + (lVar12 * 2 + -1) * 8;
    }
    if (pacVar9 != pacStack_4d0) {
      pcStack_4d8 = (code *)0x131ab9;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131ab9:
      pcStack_4d8 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_708,"typed read of ",0xf);
      pcStack_730 = (code *)0x131b1e;
      pacStack_710 = mp_nums_00;
      lStack_500 = lVar12;
      uStack_4f8 = uVar16;
      pcStack_4f0 = pcVar18;
      pcStack_4e8 = pcVar15;
      pcStack_4e0 = pcVar19;
      pcStack_4d8 = (code *)unaff_RBP;
      iVar3 = snprintf(acStack_708 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar18 = acStack_708 + (long)iVar3 + 0xe;
      pcStack_730 = (code *)0x131b3f;
      iVar3 = snprintf(pcVar18,(size_t)(&bStack_608 + -(long)pcVar18)," into ");
      __maxlen = &bStack_608 + -(long)(pcVar18 + iVar3);
      pcStack_730 = (code *)0x131b59;
      snprintf(pcVar18 + iVar3,(size_t)__maxlen,"double");
      pcStack_730 = (code *)0x131b68;
      _space((FILE *)_stdout);
      lVar5 = 1;
      pcStack_730 = (code *)0x131b87;
      fwrite("# ",2,1,_stdout);
      pcStack_730 = (code *)0x131b94;
      fputs(acStack_708,_stdout);
      pcVar14 = (code *)0xa;
      pcStack_730 = (code *)0x131ba1;
      fputc(10,_stdout);
      puVar17 = (undefined8 *)(auStack_607 + 1);
      bStack_608 = 0xca;
      _auStack_607 = 0x1059c84a;
      uStack_5ff._7_1_ = 0xcb;
      uStack_5f7 = 0x220b5941;
      lVar12 = 0;
      goto LAB_00131bd0;
    }
  }
  else if (mVar2 == MP_FLOAT) {
    if (bVar1 != 0xca) {
LAB_00131a95:
      pcStack_4d8 = (code *)0x131ab4;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar11 = *(uint *)(pcVar19 + -1);
    fVar7 = (float)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18);
    if ((fVar7 != fStack_4c0) || (NAN(fVar7) || NAN(fStack_4c0))) goto LAB_00131a6c;
    pcVar15 = pcVar19 + 3;
  }
  else if (mVar2 == MP_INT) {
    pacVar9 = (char (*) [16])(long)(char)bVar1;
    switch(bVar1) {
    case 0xd0:
      pacVar9 = (char (*) [16])(long)pcVar19[-1];
      break;
    case 0xd1:
      pacVar9 = (char (*) [16])
                (long)(short)(*(ushort *)(pcVar19 + -1) << 8 | *(ushort *)(pcVar19 + -1) >> 8);
      pcVar15 = acStack_397 + lVar5 + -6;
      break;
    case 0xd2:
      uVar11 = *(uint *)(pcVar19 + -1);
      pacVar9 = (char (*) [16])
                (long)(int)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                           uVar11 << 0x18);
      pcVar15 = acStack_397 + lVar5 + -4;
      break;
    case 0xd3:
      uVar8 = *(ulong *)(pcVar19 + -1);
      pacVar9 = (char (*) [16])
                (uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                 (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                 (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38);
      pcVar15 = acStack_397 + lVar12 * 0x10;
      break;
    default:
      if (bVar1 < 0xe0) {
        pcStack_4d8 = (code *)0x131a67;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00131a67;
      }
      pcVar15 = acStack_397 + (lVar12 * 2 + -1) * 8;
    }
    if (pacVar9 != pacStack_4d0) goto LAB_00131ab9;
  }
  else {
    if (bVar1 != 0xcb) goto LAB_00131a71;
    uVar8 = *(ulong *)(pcVar19 + -1);
    dVar10 = (double)(uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                      (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                      (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                      (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
    if ((dVar10 != dStack_4b8) || (NAN(dVar10) || NAN(dStack_4b8))) {
      pcStack_4d8 = (code *)0x131a95;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_00131a95;
    }
    pcVar15 = acStack_397 + lVar12 * 0x10;
  }
  unaff_RBP = pcVar19 + -2;
  pcVar18 = (char *)(ulong)(uint)(int)(char)bVar1;
  dStack_4b0 = 0.0;
  pcStack_4d8 = (code *)0x131948;
  pcStack_4c8 = unaff_RBP;
  iVar3 = (*pcStack_4a8)(&pcStack_4c8,&dStack_4b0);
  if ((char)uStack_4bc == '\0') {
    pcStack_4d8 = (code *)0x131a18;
    _ok((uint)(iVar3 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar18);
    bVar20 = unaff_RBP == pcStack_4c8;
    pcVar15 = "mp_num_pos2 == mp_nums[i]";
    iVar3 = 0x738;
    fmt = "check position";
  }
  else {
    unaff_RBP = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_4d8 = (code *)0x131982;
    _ok((uint)(iVar3 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar18);
    pcStack_4d8 = (code *)0x1319aa;
    _ok((uint)(pcVar15 == pcStack_4c8),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar20 = ABS(dStack_4b8 - dStack_4b0) < 1e-15;
    pcVar15 = "double_eq(num1, num2)";
    iVar3 = 0x73e;
    fmt = "check float number";
  }
  mp_nums_00 = (char (*) [16])(ulong)bVar20;
  pcStack_4d8 = (code *)0x131a40;
  _ok((uint)bVar20,pcVar15,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar3,
      fmt);
  lVar12 = lVar12 + 1;
  pcVar19 = pcVar19 + 0x10;
  uVar16 = uVar16 - 1;
  if (uVar16 == 0) {
    return;
  }
  goto LAB_001317a5;
LAB_00131bd0:
  lVar6 = lVar12 * 0x10;
  bVar1 = *(byte *)((long)puVar17 + -2);
  uVar16 = (ulong)bVar1;
  mVar2 = mp_type_hint[uVar16];
  puVar13 = puVar17;
  if (mVar2 == MP_UINT) {
    switch(bVar1) {
    case 0xcc:
      uVar16 = (ulong)*(byte *)((long)puVar17 + -1);
      break;
    case 0xcd:
      uVar16 = (ulong)(ushort)(*(ushort *)((long)puVar17 + -1) << 8 |
                              *(ushort *)((long)puVar17 + -1) >> 8);
      puVar13 = (undefined8 *)(auStack_605 + lVar6);
      break;
    case 0xce:
      uVar11 = *(uint *)((long)puVar17 + -1);
      uVar16 = (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                      uVar11 << 0x18);
      puVar13 = (undefined8 *)(auStack_605 + lVar6 + 2);
      break;
    case 0xcf:
      uVar16 = *(ulong *)((long)puVar17 + -1);
      uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
               (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
               (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28
               | uVar16 << 0x38;
      puVar13 = &uStack_5ff + lVar12 * 2;
      break;
    default:
      if ((char)bVar1 < '\0') {
LAB_00131e46:
        pcStack_730 = (code *)0x131e4b;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e4b:
        pcStack_730 = (code *)0x131e50;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e50:
        pcStack_730 = (code *)0x131e6f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar13 = (undefined8 *)(auStack_607 + lVar6);
    }
    if (uVar16 != 0x642c88) {
      pcStack_730 = (code *)0x131e98;
      test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e98:
      pcStack_730 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_940,"typed read of ",0xf);
      puStack_740 = puVar13;
      pbStack_738 = __maxlen;
      pcStack_730 = (code *)lVar5;
      iVar3 = snprintf(acStack_940 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar18 = acStack_940 + (long)iVar3 + 0xe;
      iVar3 = snprintf(pcVar18,(size_t)(&uStack_840 + -(long)pcVar18)," into ");
      snprintf(pcVar18 + iVar3,(size_t)(&uStack_840 + -(long)(pcVar18 + iVar3)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_940,_stdout);
      fputc(10,_stdout);
      uStack_840 = 0xcb;
      uStack_83f = 0xb81e85eb513816c0;
      puStack_948 = &uStack_840;
      dStack_950 = 0.0;
      iVar3 = (*pcVar14)(&puStack_948,&dStack_950);
      _ok((uint)(iVar3 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_837 == puStack_948),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_950) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
  }
  else if (mVar2 == MP_FLOAT) {
    if (bVar1 != 0xca) {
LAB_00131e74:
      pcStack_730 = (code *)0x131e93;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar11 = *(uint *)((long)puVar17 + -1);
    fVar7 = (float)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18);
    if ((fVar7 != 6.565e+06) || (NAN(fVar7))) goto LAB_00131e4b;
    puVar13 = (undefined8 *)((long)puVar17 + 3);
  }
  else if (mVar2 == MP_INT) {
    uVar16 = (ulong)(char)bVar1;
    switch(bVar1) {
    case 0xd0:
      uVar16 = (ulong)*(char *)((long)puVar17 + -1);
      break;
    case 0xd1:
      uVar16 = (ulong)(short)(*(ushort *)((long)puVar17 + -1) << 8 |
                             *(ushort *)((long)puVar17 + -1) >> 8);
      puVar13 = (undefined8 *)(auStack_605 + lVar6);
      break;
    case 0xd2:
      uVar11 = *(uint *)((long)puVar17 + -1);
      uVar16 = (ulong)(int)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                           uVar11 << 0x18);
      puVar13 = (undefined8 *)(auStack_605 + lVar6 + 2);
      break;
    case 0xd3:
      uVar16 = *(ulong *)((long)puVar17 + -1);
      uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
               (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
               (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28
               | uVar16 << 0x38;
      puVar13 = &uStack_5ff + lVar12 * 2;
      break;
    default:
      if (bVar1 < 0xe0) {
        pcStack_730 = (code *)0x131e46;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00131e46;
      }
      puVar13 = (undefined8 *)(auStack_607 + lVar6);
    }
    if (uVar16 != 0x642c88) goto LAB_00131e98;
  }
  else {
    if (bVar1 != 0xcb) goto LAB_00131e50;
    uVar16 = *(ulong *)((long)puVar17 + -1);
    dVar10 = (double)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                      (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                      (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                      (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
    if ((dVar10 != 6565000.0) || (NAN(dVar10))) {
      pcStack_730 = (code *)0x131e74;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      goto LAB_00131e74;
    }
    puVar13 = &uStack_5ff + lVar12 * 2;
  }
  puStack_718 = (undefined8 *)((long)puVar17 + -2);
  __maxlen = (byte *)(ulong)(uint)(int)(char)bVar1;
  dStack_720 = 0.0;
  pcStack_730 = (code *)0x131d8a;
  iVar3 = (*(code *)pacStack_710)(&puStack_718,&dStack_720);
  pcStack_730 = (code *)0x131db2;
  _ok((uint)(iVar3 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",__maxlen);
  pcStack_730 = (code *)0x131dda;
  _ok((uint)(puVar13 == puStack_718),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar20 = ABS(6565000.0 - dStack_720) < 1e-15;
  pcVar14 = (code *)(ulong)bVar20;
  pcStack_730 = (code *)0x131e1f;
  _ok((uint)bVar20,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar12 = lVar12 + 1;
  puVar17 = puVar17 + 2;
  lVar5 = lVar5 + -1;
  if (lVar5 != 0) {
    return;
  }
  goto LAB_00131bd0;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}